

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
          (QPDFFormFieldObjectHelper *this,QPDFObjectHandle *oh)

{
  Members *__p;
  QPDFObjectHandle local_28;
  QPDFObjectHandle *local_18;
  QPDFObjectHandle *oh_local;
  QPDFFormFieldObjectHelper *this_local;
  
  local_18 = oh;
  oh_local = (QPDFObjectHandle *)this;
  QPDFObjectHandle::QPDFObjectHandle(&local_28,oh);
  QPDFObjectHelper::QPDFObjectHelper(&this->super_QPDFObjectHelper,&local_28);
  QPDFObjectHandle::~QPDFObjectHandle(&local_28);
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFFormFieldObjectHelper_0058be88;
  __p = (Members *)operator_new(1);
  std::shared_ptr<QPDFFormFieldObjectHelper::Members>::
  shared_ptr<QPDFFormFieldObjectHelper::Members,void>(&this->m,__p);
  return;
}

Assistant:

QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(QPDFObjectHandle oh) :
    QPDFObjectHelper(oh),
    m(new Members())
{
}